

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O0

void nonstd::sv_lite::detail::write_padding<std::ostream>
               (basic_ostream<char,_std::char_traits<char>_> *os,streamsize n)

{
  char cVar1;
  undefined8 local_20;
  streamsize i;
  streamsize n_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
    cVar1 = std::ios::rdbuf();
    std::ios::fill();
    std::streambuf::sputc(cVar1);
  }
  return;
}

Assistant:

void write_padding( Stream & os, std::streamsize n )
{
    for ( std::streamsize i = 0; i < n; ++i )
        os.rdbuf()->sputc( os.fill() );
}